

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O1

void __thiscall QToolBar::setIconSize(QToolBar *this,QSize *iconSize)

{
  long lVar1;
  Representation RVar2;
  QWidget *this_00;
  QLayout *pQVar3;
  long *plVar4;
  QToolBar *pQVar5;
  QSize QVar6;
  QStyle *pQVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  void *local_48;
  ulong *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  QVar6 = *iconSize;
  uVar8 = (ulong)QVar6 >> 0x20;
  if (((ulong)QVar6 & 0x8000000080000000) != 0) {
    this_00 = (QWidget *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
    if (this_00 != (QWidget *)0x0) {
      pQVar3 = QWidget::layout(this_00);
      if (pQVar3 != (QLayout *)0x0) {
        pQVar3 = QWidget::layout(this_00);
        do {
          plVar4 = (long *)(**(code **)(*(long *)pQVar3 + 0xa8))(pQVar3);
          if (plVar4 != (long *)0x0) {
            pQVar5 = (QToolBar *)(**(code **)(*plVar4 + 0x68))(plVar4);
            if (pQVar5 == this) {
              QVar6 = QMainWindow::iconSize((QMainWindow *)this_00);
              uVar8 = (ulong)QVar6 >> 0x20;
            }
          }
        } while ((plVar4 != (long *)0x0) && ((int)(QVar6.wd.m_i.m_i | (uint)uVar8) < 0));
      }
    }
  }
  RVar2 = QVar6.wd.m_i;
  if ((int)(RVar2.m_i | (uint)uVar8) < 0) {
    pQVar7 = QWidget::style(&this->super_QWidget);
    RVar2.m_i = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x3b,0,this);
    uVar8 = (ulong)(uint)RVar2.m_i;
  }
  if ((*(uint *)(lVar1 + 0x264) != RVar2.m_i) || (*(int *)(lVar1 + 0x268) != (int)uVar8)) {
    *(ulong *)(lVar1 + 0x264) = (ulong)(uint)RVar2.m_i | uVar8 << 0x20;
    QWidget::setMinimumSize(&this->super_QWidget,0,0);
    local_48 = (void *)0x0;
    puStack_40 = (ulong *)(lVar1 + 0x264);
    QMetaObject::activate((QObject *)this,&staticMetaObject,4,&local_48);
  }
  *(bool *)(lVar1 + 0x254) = -1 < ((iconSize->ht).m_i | (iconSize->wd).m_i);
  (**(code **)(**(long **)(lVar1 + 0x278) + 0x70))();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBar::setIconSize(const QSize &iconSize)
{
    Q_D(QToolBar);
    QSize sz = iconSize;
    if (!sz.isValid()) {
        QMainWindow *mw = qobject_cast<QMainWindow *>(parentWidget());
        if (mw && mw->layout()) {
            QLayout *layout = mw->layout();
            int i = 0;
            QLayoutItem *item = nullptr;
            do {
                item = layout->itemAt(i++);
                if (item && (item->widget() == this))
                    sz = mw->iconSize();
            } while (!sz.isValid() && item != nullptr);
        }
    }
    if (!sz.isValid()) {
        const int metric = style()->pixelMetric(QStyle::PM_ToolBarIconSize, nullptr, this);
        sz = QSize(metric, metric);
    }
    if (d->iconSize != sz) {
        d->iconSize = sz;
        setMinimumSize(0, 0);
        emit iconSizeChanged(d->iconSize);
    }
    d->explicitIconSize = iconSize.isValid();

    d->layout->invalidate();
}